

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_130045c::Target::DumpLinkCommandFragments
          (Value *__return_storage_ptr__,Target *this)

{
  undefined8 uVar1;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar2;
  cmLocalGenerator *this_00;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *extraout_RAX;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *extraout_RAX_00;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar3;
  cmOutputConverter *outputConverter;
  undefined1 local_228 [32];
  element_type *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  string local_1f8;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  Value local_158;
  undefined1 local_130 [32];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *local_110;
  undefined8 local_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  pointer local_b0;
  pointer local_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [16];
  cmLinkLineComputer linkLineComputer;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  local_178._0_8_ = local_178 + 0x10;
  local_178._8_8_ = 0;
  local_178[0x10] = '\0';
  local_198._0_8_ = local_198 + 0x10;
  local_198._8_8_ = 0;
  local_198[0x10] = '\0';
  local_1b8._0_8_ = local_1b8 + 0x10;
  local_1b8._8_8_ = 0;
  local_1b8[0x10] = '\0';
  local_1d8._0_8_ = local_1d8 + 0x10;
  local_1d8._8_8_ = 0;
  local_1d8[0x10] = '\0';
  pcVar3 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_130 + 0x10);
  local_130._8_8_ = 0;
  local_130[0x10] = '\0';
  local_130._0_8_ = pcVar3;
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  outputConverter = &this_00->super_cmOutputConverter;
  if (this_00 == (cmLocalGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_158,this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_228,(cmStateSnapshot *)&local_158);
  cmLinkLineComputer::cmLinkLineComputer
            (&linkLineComputer,outputConverter,(cmStateDirectory *)local_228);
  cmLocalGenerator::GetTargetFlags
            (this_00,&linkLineComputer,this->Config,(string *)local_130,(string *)local_178,
             (string *)local_198,(string *)local_1b8,(string *)local_1d8,this->GT);
  cmSystemTools::TrimWhitespace((string *)local_228,(string *)local_178);
  std::__cxx11::string::operator=((string *)local_178,(string *)local_228);
  pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_228 + 0x10);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  cmSystemTools::TrimWhitespace((string *)local_228,(string *)local_198);
  std::__cxx11::string::operator=((string *)local_198,(string *)local_228);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  cmSystemTools::TrimWhitespace((string *)local_228,(string *)local_1b8);
  std::__cxx11::string::operator=((string *)local_1b8,(string *)local_228);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  cmSystemTools::TrimWhitespace((string *)local_228,(string *)local_1d8);
  std::__cxx11::string::operator=((string *)local_1d8,(string *)local_228);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  cmSystemTools::TrimWhitespace((string *)local_228,(string *)local_130);
  std::__cxx11::string::operator=((string *)local_130,(string *)local_228);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ != pcVar2) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  uVar1 = local_178._8_8_;
  if (local_178._8_8_ != 0) {
    pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_178 + 0x10);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_178._0_8_ == pcVar2) {
      local_80._8_8_ = local_178._24_8_;
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_178._0_8_;
LAB_00370eb9:
      local_178._0_8_ = pcVar2;
      local_228._0_8_ = local_228 + 0x10;
      local_80._1_7_ = local_178._17_7_;
      local_80[0] = local_178[0x10];
      local_228._16_8_ = local_80._0_8_;
      local_228._24_8_ = local_80._8_8_;
    }
    else {
      local_228._16_8_ = CONCAT71(local_178._17_7_,local_178[0x10]);
      if ((pointer)local_178._0_8_ == (pointer)local_80) goto LAB_00370eb9;
      local_228._0_8_ = local_178._0_8_;
      local_178._0_8_ = pcVar2;
    }
    local_178[0x10] = '\0';
    local_178._8_8_ = 0;
    local_228._8_8_ = uVar1;
    local_a0._24_8_ = (pointer)0x0;
    local_80._0_8_ = (ulong)(uint7)local_178._17_7_ << 8;
    local_208 = (element_type *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_a0._16_8_ = (pointer)local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"flags","");
    DumpCommandFragment(&local_158,this,
                        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_158);
    Json::Value::~Value(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
    }
    if ((pointer)local_a0._16_8_ != (pointer)local_80) {
      operator_delete((void *)local_a0._16_8_,
                      (ulong)((long)&((PositionType *)local_80._0_8_)->Tree + 1));
    }
  }
  uVar1 = local_198._8_8_;
  if (local_198._8_8_ != 0) {
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_198._0_8_ ==
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_198 + 0x10)) {
      local_a0._8_8_ = local_198._24_8_;
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_198._0_8_;
LAB_00371057:
      local_198._0_8_ = pcVar2;
      local_228._0_8_ = local_228 + 0x10;
      local_a0._1_7_ = local_198._17_7_;
      local_a0[0] = local_198[0x10];
      local_228._16_8_ = local_a0._0_8_;
      local_228._24_8_ = local_a0._8_8_;
    }
    else {
      local_228._16_8_ = CONCAT71(local_198._17_7_,local_198[0x10]);
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_198 + 0x10);
      if ((pointer)local_198._0_8_ == (pointer)local_a0) goto LAB_00371057;
      local_228._0_8_ = local_198._0_8_;
      local_198._0_8_ =
           (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_198 + 0x10);
    }
    local_198[0x10] = '\0';
    local_198._8_8_ = 0;
    local_228._8_8_ = uVar1;
    local_a8 = (pointer)0x0;
    local_a0._0_8_ = (ulong)(uint7)local_198._17_7_ << 8;
    local_208 = (element_type *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_b0 = (pointer)local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"flags","");
    DumpCommandFragment(&local_158,this,
                        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_158);
    Json::Value::~Value(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
    }
    if (local_b0 != (pointer)local_a0) {
      operator_delete(local_b0,(ulong)((long)&((PositionType *)local_a0._0_8_)->Tree + 1));
    }
  }
  uVar1 = local_1b8._8_8_;
  if (local_1b8._8_8_ != 0) {
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_1b8._0_8_ ==
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1b8 + 0x10)) {
      local_c0._8_8_ = local_1b8._24_8_;
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_1b8._0_8_;
LAB_003711e6:
      local_1b8._0_8_ = pcVar2;
      local_228._0_8_ = local_228 + 0x10;
      local_c0._1_7_ = local_1b8._17_7_;
      local_c0[0] = local_1b8[0x10];
      local_228._16_8_ = local_c0._0_8_;
      local_228._24_8_ = local_c0._8_8_;
    }
    else {
      local_228._16_8_ = CONCAT71(local_1b8._17_7_,local_1b8[0x10]);
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1b8 + 0x10);
      if ((pointer)local_1b8._0_8_ == (pointer)local_c0) goto LAB_003711e6;
      local_228._0_8_ = local_1b8._0_8_;
      local_1b8._0_8_ =
           (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1b8 + 0x10);
    }
    local_1b8[0x10] = '\0';
    local_1b8._8_8_ = 0;
    local_228._8_8_ = uVar1;
    local_e0._24_8_ = (pointer)0x0;
    local_c0._0_8_ = (ulong)(uint7)local_1b8._17_7_ << 8;
    local_208 = (element_type *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_e0._16_8_ = (pointer)local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"frameworkPath","");
    DumpCommandFragment(&local_158,this,
                        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_158);
    Json::Value::~Value(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
    }
    if ((pointer)local_e0._16_8_ != (pointer)local_c0) {
      operator_delete((void *)local_e0._16_8_,
                      (ulong)((long)&((PositionType *)local_c0._0_8_)->Tree + 1));
    }
  }
  uVar1 = local_1d8._8_8_;
  if (local_1d8._8_8_ != 0) {
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_1d8._0_8_ ==
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1d8 + 0x10)) {
      local_e0._8_8_ = local_1d8._24_8_;
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_1d8._0_8_;
LAB_00371366:
      local_1d8._0_8_ = pcVar2;
      local_228._0_8_ = local_228 + 0x10;
      local_e0._1_7_ = local_1d8._17_7_;
      local_e0[0] = local_1d8[0x10];
      local_228._16_8_ = local_e0._0_8_;
      local_228._24_8_ = local_e0._8_8_;
    }
    else {
      local_228._16_8_ = CONCAT71(local_1d8._17_7_,local_1d8[0x10]);
      pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1d8 + 0x10);
      if ((pointer)local_1d8._0_8_ == (pointer)local_e0) goto LAB_00371366;
      local_228._0_8_ = local_1d8._0_8_;
      local_1d8._0_8_ =
           (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1d8 + 0x10);
    }
    local_1d8[0x10] = '\0';
    local_1d8._8_8_ = 0;
    local_228._8_8_ = uVar1;
    local_100._24_8_ = (pointer)0x0;
    local_e0._0_8_ = (ulong)(uint7)local_1d8._17_7_ << 8;
    local_208 = (element_type *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_100._16_8_ = (pointer)local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"libraryPath","");
    DumpCommandFragment(&local_158,this,
                        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_158);
    Json::Value::~Value(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
    }
    if ((pointer)local_100._16_8_ != (pointer)local_e0) {
      operator_delete((void *)local_100._16_8_,
                      (ulong)((long)&((PositionType *)local_e0._0_8_)->Tree + 1));
    }
  }
  uVar1 = local_130._8_8_;
  if (local_130._8_8_ == 0) goto LAB_003715d7;
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_130._0_8_ == pcVar3) {
    local_100._8_8_ = local_130._24_8_;
    pcVar2 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_130._0_8_;
LAB_003714f6:
    local_130._0_8_ = pcVar2;
    local_228._0_8_ = local_228 + 0x10;
    local_100._1_7_ = local_130._17_7_;
    local_100[0] = local_130[0x10];
    local_228._16_8_ = local_100._0_8_;
    local_228._24_8_ = local_100._8_8_;
  }
  else {
    local_228._16_8_ = CONCAT71(local_130._17_7_,local_130[0x10]);
    pcVar2 = pcVar3;
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_130._0_8_ ==
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_100) goto LAB_003714f6;
    local_228._0_8_ = local_130._0_8_;
    local_130._0_8_ = pcVar3;
  }
  local_130[0x10] = '\0';
  local_130._8_8_ = 0;
  local_228._8_8_ = uVar1;
  local_108 = 0;
  local_100._0_8_ = (ulong)(uint7)local_130._17_7_ << 8;
  local_208 = (element_type *)0x0;
  _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_110 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"libraries","");
  DumpCommandFragment(&local_158,this,
                      (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_228,&local_1f8);
  Json::Value::append(__return_storage_ptr__,&local_158);
  Json::Value::~Value(&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
  }
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_228._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  if (local_110 != (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_100) {
    operator_delete(local_110,(ulong)((long)&((PositionType *)local_100._0_8_)->Tree + 1));
  }
LAB_003715d7:
  cmLinkLineComputer::~cmLinkLineComputer(&linkLineComputer);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_130._0_8_ != pcVar3) {
    operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
  }
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_1d8._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,CONCAT71(local_1d8._17_7_,local_1d8[0x10]) + 1);
  }
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_1b8._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  }
  pcVar3 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_198 + 0x10);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_198._0_8_ != pcVar3) {
    operator_delete((void *)local_198._0_8_,CONCAT71(local_198._17_7_,local_198[0x10]) + 1);
    pcVar3 = extraout_RAX;
  }
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_178._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,CONCAT71(local_178._17_7_,local_178[0x10]) + 1);
    pcVar3 = extraout_RAX_00;
  }
  return (Value *)pcVar3;
}

Assistant:

Json::Value Target::DumpLinkCommandFragments()
{
  Json::Value linkFragments = Json::arrayValue;

  std::string linkLanguageFlags;
  std::string linkFlags;
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmLinkLineComputer linkLineComputer(lg,
                                      lg->GetStateSnapshot().GetDirectory());
  lg->GetTargetFlags(&linkLineComputer, this->Config, linkLibs,
                     linkLanguageFlags, linkFlags, frameworkPath, linkPath,
                     this->GT);
  linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
  linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
  frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
  linkPath = cmSystemTools::TrimWhitespace(linkPath);
  linkLibs = cmSystemTools::TrimWhitespace(linkLibs);

  if (!linkLanguageFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLanguageFlags), "flags"));
  }

  if (!linkFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkFlags), "flags"));
  }

  if (!frameworkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(frameworkPath), "frameworkPath"));
  }

  if (!linkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkPath), "libraryPath"));
  }

  if (!linkLibs.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLibs), "libraries"));
  }

  return linkFragments;
}